

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Path::makePath(Path *this,string *path,InArgs *in)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  pointer ppPVar7;
  allocator local_91;
  Path *local_90;
  InArgs *local_88;
  pointer local_80;
  PathArgument local_78;
  char *local_50 [2];
  char local_40 [16];
  
  if (path->_M_string_length != 0) {
    pcVar5 = (path->_M_dataplus)._M_p;
    pcVar6 = pcVar5 + path->_M_string_length;
    ppPVar7 = (in->
              super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    paVar1 = &local_78.key_.field_2;
    local_90 = this;
    local_88 = in;
    local_80 = ppPVar7;
    do {
      cVar2 = *pcVar5;
      if (cVar2 == '%') {
        if ((ppPVar7 !=
             (local_88->
             super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
             )._M_impl.super__Vector_impl_data._M_finish) && ((*ppPVar7)->kind_ == kindKey)) {
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                    (&local_90->args_,*ppPVar7);
        }
LAB_001272e5:
        pcVar4 = pcVar5 + 1;
      }
      else {
        if (cVar2 == '.') goto LAB_001272e5;
        if (cVar2 == '[') {
          pcVar4 = pcVar5 + 1;
          if (pcVar5[1] == '%') {
            if ((local_80 !=
                 (local_88->
                 super__Vector_base<const_Json::PathArgument_*,_std::allocator<const_Json::PathArgument_*>_>
                 )._M_impl.super__Vector_impl_data._M_finish) && ((*local_80)->kind_ == kindIndex))
            {
              std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::push_back
                        (&local_90->args_,*local_80);
            }
          }
          else {
            local_78.index_ = 0;
            for (; (pcVar4 != pcVar6 && ((byte)(*pcVar4 - 0x30U) < 10)); pcVar4 = pcVar4 + 1) {
              local_78.index_ = (uint)(byte)(*pcVar4 - 0x30U) + local_78.index_ * 10;
            }
            local_78.key_._M_string_length = 0;
            local_78.key_.field_2._M_local_buf[0] = '\0';
            local_78.kind_ = kindIndex;
            local_78.key_._M_dataplus._M_p = (pointer)paVar1;
            std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
            emplace_back<Json::PathArgument>(&local_90->args_,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78.key_._M_dataplus._M_p != paVar1) {
              operator_delete(local_78.key_._M_dataplus._M_p);
            }
          }
          pcVar4 = pcVar4 + (pcVar4 != pcVar6);
          ppPVar7 = local_80;
        }
        else {
          pcVar4 = pcVar5;
          if (pcVar5 != pcVar6) {
            while ((((pcVar3 = pcVar4 + 1, cVar2 != '\0' && (cVar2 != '.')) && (cVar2 != '[')) &&
                   (pcVar4 = pcVar3, pcVar3 != pcVar6))) {
              cVar2 = *pcVar3;
            }
          }
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar5,pcVar4);
          std::__cxx11::string::string((string *)&local_78,local_50[0],&local_91);
          local_78.index_ = 0;
          local_78.kind_ = kindKey;
          std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::
          emplace_back<Json::PathArgument>(&local_90->args_,&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78.key_._M_dataplus._M_p != paVar1) {
            operator_delete(local_78.key_._M_dataplus._M_p);
          }
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
        }
      }
      pcVar5 = pcVar4;
    } while (pcVar4 != pcVar6);
  }
  return;
}

Assistant:

void Path::makePath(const std::string& path, const InArgs& in) {
  const char* current = path.c_str();
  const char* end = current + path.length();
  InArgs::const_iterator itInArg = in.begin();
  while (current != end) {
    if (*current == '[') {
      ++current;
      if (*current == '%')
        addPathInArg(path, in, itInArg, PathArgument::kindIndex);
      else {
        ArrayIndex index = 0;
        for (; current != end && *current >= '0' && *current <= '9'; ++current)
          index = index * 10 + ArrayIndex(*current - '0');
        args_.push_back(index);
      }
      if (current == end || *current++ != ']')
        invalidPath(path, int(current - path.c_str()));
    } else if (*current == '%') {
      addPathInArg(path, in, itInArg, PathArgument::kindKey);
      ++current;
    } else if (*current == '.') {
      ++current;
    } else {
      const char* beginName = current;
      while (current != end && !strchr("[.", *current))
        ++current;
      args_.push_back(std::string(beginName, current));
    }
  }
}